

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

S2ShapeIndexRegion<S2ShapeIndex> * __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::Clone(S2ShapeIndexRegion<S2ShapeIndex> *this)

{
  S2ShapeIndexRegion<S2ShapeIndex> *this_00;
  
  this_00 = (S2ShapeIndexRegion<S2ShapeIndex> *)operator_new(0x28);
  S2ShapeIndexRegion(this_00,(this->contains_query_).index_);
  return this_00;
}

Assistant:

S2ShapeIndexRegion<IndexType>* S2ShapeIndexRegion<IndexType>::Clone() const {
  return new S2ShapeIndexRegion<IndexType>(&index());
}